

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestPackColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Dring *pDVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  fpclass_type *pfVar18;
  
  pCVar1 = &(this->u).col;
  pDVar12 = (this->u).col.list.next;
  if ((Col *)pDVar12 == pCVar1) {
    uVar15 = 0;
  }
  else {
    pnVar4 = (this->u).col.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (this->u).col.idx;
    piVar6 = (this->u).col.len;
    piVar7 = (this->u).col.max;
    piVar8 = (this->u).col.start;
    uVar17 = 0;
    do {
      iVar2 = pDVar12->idx;
      if (piVar8[iVar2] != (int)uVar17) {
        do {
          iVar2 = pDVar12->idx;
          iVar3 = piVar8[iVar2];
          lVar13 = (long)iVar3;
          piVar8[iVar2] = (int)uVar17;
          piVar7[iVar2] = piVar6[iVar2];
          iVar2 = piVar6[iVar2];
          if (0 < iVar2) {
            uVar16 = (ulong)(int)uVar17;
            lVar14 = lVar13;
            uVar17 = uVar16;
            pfVar18 = &(pnVar4->m_backend).fpclass;
            do {
              *(undefined8 *)(pfVar18 + uVar16 * 0xe + -4) =
                   *(undefined8 *)(pfVar18 + lVar13 * 0xe + -4);
              uVar9 = *(undefined8 *)(pfVar18 + lVar13 * 0xe + -0xc);
              uVar10 = *(undefined8 *)(pfVar18 + lVar13 * 0xe + -0xc + 2);
              uVar11 = *(undefined8 *)(pfVar18 + lVar13 * 0xe + -8 + 2);
              *(undefined8 *)(pfVar18 + uVar16 * 0xe + -8) =
                   *(undefined8 *)(pfVar18 + lVar13 * 0xe + -8);
              *(undefined8 *)(pfVar18 + uVar16 * 0xe + -8 + 2) = uVar11;
              *(undefined8 *)(pfVar18 + uVar16 * 0xe + -0xc) = uVar9;
              *(undefined8 *)(pfVar18 + uVar16 * 0xe + -0xc + 2) = uVar10;
              pfVar18[uVar16 * 0xe + -2] = pfVar18[lVar13 * 0xe + -2];
              *(char *)(pfVar18 + uVar16 * 0xe + -1) = (char)pfVar18[lVar13 * 0xe + -1];
              *(undefined8 *)(pfVar18 + uVar16 * 0xe) = *(undefined8 *)(pfVar18 + lVar13 * 0xe);
              piVar5[uVar17] = piVar5[lVar14];
              uVar17 = uVar17 + 1;
              lVar14 = lVar14 + 1;
              pfVar18 = pfVar18 + 0xe;
            } while (lVar14 < iVar2 + iVar3);
          }
          uVar15 = (uint)uVar17;
          pDVar12 = pDVar12->next;
        } while ((Col *)pDVar12 != pCVar1);
        break;
      }
      uVar15 = (int)uVar17 + piVar6[iVar2];
      uVar17 = (ulong)uVar15;
      piVar7[iVar2] = piVar6[iVar2];
      pDVar12 = pDVar12->next;
    } while ((Col *)pDVar12 != pCVar1);
  }
  (this->u).col.used = uVar15;
  (this->u).col.max[this->thedim] = 0;
  return;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}